

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,undefined8 param_3)

{
  PlatformInterface *pPVar1;
  long *plVar2;
  VkDevice_s *pVVar3;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  size_t sVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  undefined8 *puVar9;
  long *plVar10;
  int *piVar11;
  Parameters *pPVar12;
  size_type __n;
  long lVar13;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  Environment env;
  undefined8 local_3c8;
  Move<vk::VkDevice_s_*> local_3c0;
  undefined1 local_3a8 [8];
  undefined1 auStack_3a0 [8];
  VkAllocationCallbacks *local_398;
  ios_base local_330 [272];
  Environment local_220;
  Resources local_1e8;
  
  local_3c8 = param_3;
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_3a8,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar4 = Context::getDeviceInterface(context);
  pVVar5 = Context::getDevice(context);
  local_220.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar12 = (Parameters *)context->m_progCollection;
  local_220.allocationCallbacks = (VkAllocationCallbacks *)auStack_3a0;
  local_220.maxResourceConsumers = 1;
  local_220.vkp = pPVar1;
  local_220.vkd = pDVar4;
  local_220.device = pVVar5;
  local_220.programBinaries = (BinaryCollection *)pPVar12;
  Device::Resources::Resources(&local_1e8,&local_220,(Parameters *)&local_3c8);
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_3a8);
  Device::create(&local_3c0,(Environment *)auStack_3a0,&local_1e8,pPVar12);
  pVVar3 = local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_3a8);
  if ((pointer)pVVar3 != (pointer)0x0) {
    (*local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (pVVar3,local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1e8.vki);
  if (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_3a8);
  sVar6 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar7 - sVar6,0);
  __n = 0x20;
  if (sVar6 < 0x20) {
    __n = sVar6;
  }
  local_220.vkp = context->m_platformInterface;
  local_220.vkd = Context::getDeviceInterface(context);
  local_220.device = Context::getDevice(context);
  local_220.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_220.programBinaries = context->m_progCollection;
  local_220.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_220.maxResourceConsumers = (deUint32)__n;
  Device::Resources::Resources(&local_1e8,&local_220,(Parameters *)&local_3c8);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
            *)&local_3c0,__n,(allocator_type *)local_3a8);
  local_3a8 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_3a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_3a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0," ",1);
  __s = ::vk::getTypeName<vk::VkDevice_s*>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)auStack_3a0 +
                    (int)((PlatformInterface *)((long)auStack_3a0 + -0x18))->_vptr_PlatformInterface
                   );
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_3a0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_3a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_3a0);
  std::ios_base::~ios_base(local_330);
  if (sVar6 != 0) {
    lVar13 = 0;
    do {
      puVar9 = (undefined8 *)operator_new(0x18);
      Device::create((Move<vk::VkDevice_s_*> *)local_3a8,
                     (Environment *)local_220.allocationCallbacks,&local_1e8,pPVar12);
      puVar9[2] = local_398;
      *puVar9 = local_3a8;
      puVar9[1] = auStack_3a0;
      local_3a8 = (undefined1  [8])0x0;
      auStack_3a0 = (undefined1  [8])0x0;
      local_398 = (VkAllocationCallbacks *)0x0;
      plVar10 = (long *)operator_new(0x20);
      pVVar3 = local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.object;
      *(undefined4 *)(plVar10 + 1) = 0;
      *(undefined4 *)((long)plVar10 + 0xc) = 0;
      *plVar10 = (long)&PTR__SharedPtrState_00d24710;
      plVar10[2] = (long)puVar9;
      *(undefined4 *)(plVar10 + 1) = 1;
      *(undefined4 *)((long)plVar10 + 0xc) = 1;
      plVar2 = *(long **)((long)((long)local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.object + 8)
                         + lVar13);
      if (plVar2 != plVar10) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)
             ((long)&(local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.object)->field_0x0 + lVar13)
                 = 0;
            (**(code **)(**(long **)((long)((long)local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.
                                                  object + 8) + lVar13) + 0x10))();
          }
          LOCK();
          piVar11 = (int *)(*(long *)((long)((long)pVVar3 + 8) + lVar13) + 0xc);
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            plVar2 = *(long **)((long)((long)pVVar3 + 8) + lVar13);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)((long)pVVar3 + 8) + lVar13) = 0;
          }
        }
        *(undefined8 **)((long)&pVVar3->field_0x0 + lVar13) = puVar9;
        *(long **)((long)((long)pVVar3 + 8) + lVar13) = plVar10;
        LOCK();
        *(int *)(plVar10 + 1) = (int)plVar10[1] + 1;
        UNLOCK();
        LOCK();
        piVar11 = (int *)(*(long *)((long)((long)pVVar3 + 8) + lVar13) + 0xc);
        *piVar11 = *piVar11 + 1;
        UNLOCK();
      }
      plVar2 = plVar10 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar10 + 0x10))(plVar10);
      }
      piVar11 = (int *)((long)plVar10 + 0xc);
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        (**(code **)(*plVar10 + 8))(plVar10);
      }
      if (local_3a8 != (undefined1  [8])0x0) {
        (*(code *)auStack_3a0)(local_3a8,local_398);
      }
      lVar13 = lVar13 + 0x10;
    } while (__n << 4 != lVar13);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
                     *)&local_3c0,(pointer)local_3c0.super_RefBase<vk::VkDevice_s_*>.m_data.object);
  local_3a8 = (undefined1  [8])&local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_3a8,
             (VkDevice_s *)((long)local_3a8 + (long)(_func_int ***)auStack_3a0));
  if (local_3a8 != (undefined1  [8])&local_398) {
    operator_delete((void *)local_3a8,(ulong)((long)&local_398->pUserData + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>_>_>
             *)&local_3c0);
  ::vk::InstanceDriver::~InstanceDriver(&local_1e8.vki);
  if (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0)
  {
    (*local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
              (local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_1e8.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}